

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_loader.cpp
# Opt level: O2

ze_result_t __thiscall
loader::context_t::check_drivers
          (context_t *this,ze_init_flags_t flags,ze_init_driver_type_desc_t *desc,
          ze_global_dditable_t *globalInitStored,zes_global_dditable_t *sysmanGlobalInitStored,
          bool *requireDdiReinit,bool sysmanOnly)

{
  bool bVar1;
  bool bVar2;
  ze_result_t zVar3;
  iterator __position;
  ze_init_flags_t flags_00;
  ze_result_t result;
  ze_init_driver_type_desc_t *desc_00;
  driver_vector_t *this_00;
  bool bVar4;
  string freeLibraryErrorValue;
  string initName;
  string errorMessage;
  ze_result_t local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  uint local_1d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  bool *local_170;
  long local_168;
  ze_global_dditable_t *local_160;
  zes_global_dditable_t *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_170 = requireDdiReinit;
  local_160 = globalInitStored;
  local_158 = sysmanGlobalInitStored;
  if (this->debugTraceEnabled == true) {
    if (desc == (ze_init_driver_type_desc_t *)0x0) {
      std::__cxx11::string::string((string *)&local_1d0,"flags=",(allocator *)&local_150);
      std::operator+(&local_190,"check_drivers(",&local_1d0);
      to_string_abi_cxx11_(&local_1b0,(loader *)(ulong)flags,flags_00);
      std::operator+(&local_218,&local_190,&local_1b0);
      std::operator+(&local_1f8,&local_218,")");
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::string((string *)&local_b0,(string *)&local_1f8);
      std::__cxx11::string::string((string *)&local_d0,"",(allocator *)&local_218);
      debug_trace_message(this,&local_b0,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_1f8);
LAB_001c5ada:
      bVar1 = true;
      goto LAB_001c5adc;
    }
    std::__cxx11::string::string((string *)&local_1d0,"desc->flags=",(allocator *)&local_150);
    std::operator+(&local_190,"check_drivers(",&local_1d0);
    to_string_abi_cxx11_(&local_1b0,(loader *)desc,desc_00);
    std::operator+(&local_218,&local_190,&local_1b0);
    std::operator+(&local_1f8,&local_218,")");
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::string((string *)&local_70,(string *)&local_1f8);
    std::__cxx11::string::string((string *)&local_90,"",(allocator *)&local_218);
    debug_trace_message(this,&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  else if (desc == (ze_init_driver_type_desc_t *)0x0) goto LAB_001c5ada;
  if (*(char *)(context + 0x162a) == '\0') {
    if (this->debugTraceEnabled != true) {
      return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    std::__cxx11::string::string
              ((string *)&local_1f8,
               "zeInitDrivers called first, but not supported by driver, returning uninitialized.",
               (allocator *)&local_218);
    std::__cxx11::string::string((string *)&local_f0,(string *)&local_1f8);
    std::__cxx11::string::string((string *)&local_110,"",(allocator *)&local_218);
    debug_trace_message(this,&local_f0,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_1f8);
    return ZE_RESULT_ERROR_UNINITIALIZED;
  }
  bVar1 = false;
LAB_001c5adc:
  std::__cxx11::string::string((string *)&local_1f8,"zeInit",(allocator *)&local_218);
  if (!bVar1) {
    std::__cxx11::string::assign((char *)&local_1f8);
  }
  if (sysmanOnly) {
    std::__cxx11::string::assign((char *)&local_1f8);
    this_00 = &this->zesDrivers;
  }
  else {
    this_00 = &this->zeDrivers;
  }
  local_168 = (long)(this_00->
                    super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>)._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)(this_00->
                    super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>)._M_impl
                    .super__Vector_impl_data._M_start;
  bVar4 = local_168 != 0xd98;
  bVar1 = getenv_tobool("ZE_ENABLE_PCI_ID_DEVICE_ORDER");
  bVar2 = getenv_tobool("ZET_ENABLE_PROGRAM_INSTRUMENTATION");
  *(bool *)(context + 0x165d) = bVar2;
  __position._M_current =
       (this_00->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_1d4 = (uint)sysmanOnly;
  do {
    if (__position._M_current ==
        (this_00->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      local_220 = ZE_RESULT_ERROR_UNINITIALIZED;
      if (__position._M_current !=
          (this_00->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>)._M_impl
          .super__Vector_impl_data._M_start) {
        local_220 = ZE_RESULT_SUCCESS;
      }
      break;
    }
    (__position._M_current)->pciOrderingRequested = bVar1;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    local_218._M_string_length = 0;
    local_218.field_2._M_local_buf[0] = '\0';
    zVar3 = init_driver(this,__position._M_current,flags,desc,local_160,local_158,SUB41(local_1d4,0)
                       );
    if (zVar3 == ZE_RESULT_SUCCESS) {
      (__position._M_current)->driverInuse = true;
      __position._M_current = __position._M_current + 1;
      bVar2 = true;
    }
    else {
      if (((__position._M_current)->driverInuse == false) && (*(char *)(context + 0x162a) == '\0'))
      {
        if (this->debugTraceEnabled == true) {
          std::operator+(&local_150,"Check Drivers Failed on ",&(__position._M_current)->name);
          std::operator+(&local_1b0,&local_150," , driver will be removed. ");
          std::operator+(&local_1d0,&local_1b0,&local_1f8);
          std::operator+(&local_190,&local_1d0," failed with ");
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::string((string *)&local_50,(string *)&local_190);
          to_string_abi_cxx11_(&local_130,(loader *)(ulong)zVar3,result);
          debug_trace_message(this,&local_50,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_190);
        }
        __position = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::erase
                               (this_00,__position._M_current);
        if (((long)(this_00->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(this_00->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>
                   )._M_impl.super__Vector_impl_data._M_start == 0xd98) &&
           (*(char *)(context + 0x1629) == '\0')) {
          *local_170 = true;
        }
      }
      else {
        __position._M_current = __position._M_current + 1;
      }
      bVar2 = bVar4;
      if (local_168 == 0xd98) {
        local_220 = zVar3;
      }
    }
    std::__cxx11::string::~string((string *)&local_218);
  } while (bVar2);
  std::__cxx11::string::~string((string *)&local_1f8);
  return local_220;
}

Assistant:

ze_result_t context_t::check_drivers(ze_init_flags_t flags, ze_init_driver_type_desc_t* desc, ze_global_dditable_t *globalInitStored, zes_global_dditable_t *sysmanGlobalInitStored, bool *requireDdiReinit, bool sysmanOnly) {
        if (debugTraceEnabled) {
            if (desc) {
                std::string message = "check_drivers(" + std::string("desc->flags=") + loader::to_string(desc) + ")";
                debug_trace_message(message, "");
            } else {
                std::string message = "check_drivers(" + std::string("flags=") + loader::to_string(flags) + ")";
                debug_trace_message(message, "");
            }
        }
        // If zeInitDrivers is not supported by this driver, but zeInitDrivers is called first, then return uninitialized.
        if (desc && !loader::context->initDriversSupport) {
            if (debugTraceEnabled) {
                std::string message = "zeInitDrivers called first, but not supported by driver, returning uninitialized.";
                debug_trace_message(message, "");
            }
            return ZE_RESULT_ERROR_UNINITIALIZED;
        }


        bool return_first_driver_result=false;
        std::string initName = "zeInit";
        driver_vector_t *drivers = &zeDrivers;
        // If desc is set, then this is zeInitDrivers.
        if (desc) {
            initName = "zeInitDrivers";
        }
        // If this is sysmanOnly check_drivers, then zesInit is being called and we need to use zesDrivers.
        if (sysmanOnly) {
            drivers = &zesDrivers;
            initName = "zesInit";
        }
        if(drivers->size()==1) {
            return_first_driver_result=true;
        }
        bool pciOrderingRequested = getenv_tobool( "ZE_ENABLE_PCI_ID_DEVICE_ORDER" );
        loader::context->instrumentationEnabled = getenv_tobool( "ZET_ENABLE_PROGRAM_INSTRUMENTATION" );

        for(auto it = drivers->begin(); it != drivers->end(); )
        {
            it->pciOrderingRequested = pciOrderingRequested;
            std::string freeLibraryErrorValue;
            ze_result_t result = init_driver(*it, flags, desc, globalInitStored, sysmanGlobalInitStored, sysmanOnly);
            if(result != ZE_RESULT_SUCCESS) {
                // If the driver has already been init and handles are to be read, then this driver cannot be removed from the list.
                // Also, if any driver supports zeInitDrivers, then no driver can be removed to allow for different sets of drivers.
                if (!it->driverInuse && !loader::context->initDriversSupport) {
                    if (debugTraceEnabled) {
                        std::string errorMessage = "Check Drivers Failed on " + it->name + " , driver will be removed. " + initName + " failed with ";
                        debug_trace_message(errorMessage, loader::to_string(result));
                    }
                    it = drivers->erase(it);
                    // If the number of drivers is now ==1, then we need to reinit the ddi tables to pass through.
                    // If ZE_ENABLE_LOADER_INTERCEPT is set to 1, then even if drivers were removed, don't reinit the ddi tables.
                    if (drivers->size() == 1 && !loader::context->forceIntercept) {
                        *requireDdiReinit = true;
                    }
                } else {
                    it++;
                }
                if(return_first_driver_result)
                    return result;
            } else {
                // If this is a single driver system, then the first success for this driver needs to be set.
                it->driverInuse = true;
                it++;
            }
        }

        if(drivers->size() == 0)
            return ZE_RESULT_ERROR_UNINITIALIZED;

        return ZE_RESULT_SUCCESS;
    }